

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

bool __thiscall QHttp2Connection::sendClientPreface(QHttp2Connection *this)

{
  bool bVar1;
  QIODevice *pQVar2;
  long lVar3;
  long in_FS_OFFSET;
  undefined8 local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 local_2c;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = getSocket(this);
  lVar3 = QIODevice::write((char *)pQVar2,0x249520);
  if (lVar3 == 0x18) {
    bVar1 = sendSETTINGS(this);
    if (bVar1) {
      this[0x2b0] = (QHttp2Connection)0x1;
      lVar3 = (**(code **)(*(long *)pQVar2 + 0xa0))(pQVar2);
      bVar1 = true;
      if (lVar3 != 0) {
        local_40._0_4_ = 0x1d791e;
        local_40._4_4_ = 0;
        uStack_38 = 0;
        uStack_34 = 0;
        QMetaObject::invokeMethod<void(QHttp2Connection::*)()>
                  ((ContextType *)this,&local_40,QueuedConnection);
      }
      goto LAB_001d6e80;
    }
    qHttp2ConnectionLog();
    if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
        != 0) {
      local_40._0_4_ = 2;
      local_40._4_4_ = 0;
      uStack_38 = 0;
      uStack_34 = 0;
      uStack_30 = 0;
      local_2c = 0;
      local_28 = qHttp2ConnectionLog::category.name;
      bVar1 = false;
      QMessageLogger::warning((char *)&local_40,"[%p] Failed to send SETTINGS",this);
      goto LAB_001d6e80;
    }
  }
  bVar1 = false;
LAB_001d6e80:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Connection::sendClientPreface()
{
    QIODevice *socket = getSocket();
    // 3.5 HTTP/2 Connection Preface
    const qint64 written = socket->write(Http2clientPreface, clientPrefaceLength);
    if (written != clientPrefaceLength)
        return false;

    if (!sendSETTINGS()) {
        qCWarning(qHttp2ConnectionLog, "[%p] Failed to send SETTINGS", this);
        return false;
    }
    m_prefaceSent = true;
    if (socket->bytesAvailable()) // We ignore incoming data until preface is sent, so handle it now
        QMetaObject::invokeMethod(this, &QHttp2Connection::handleReadyRead, Qt::QueuedConnection);
    return true;
}